

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::Lookup
          (PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this,string_t *value)

{
  bool bVar1;
  ulong uVar2;
  primitive_dictionary_entry_t *ppVar3;
  
  uVar2 = duckdb::Hash<duckdb::string_t>((string_t)(value->value).pointer);
  do {
    uVar2 = uVar2 & this->capacity_mask;
    ppVar3 = this->dictionary;
    if (ppVar3[uVar2].index == 0xffffffff) {
LAB_002bc919:
      return ppVar3 + uVar2;
    }
    bVar1 = string_t::operator!=(&ppVar3[uVar2].value,value);
    if (!bVar1) {
      ppVar3 = this->dictionary;
      goto LAB_002bc919;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}